

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_compressBlock_fast
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  long *plVar1;
  BYTE *pBVar2;
  BYTE *pBVar3;
  long *plVar4;
  undefined8 *puVar5;
  U32 h;
  U32 *pUVar6;
  BYTE *pBVar7;
  undefined8 uVar8;
  char cVar9;
  long *plVar10;
  size_t sVar11;
  size_t sVar12;
  byte bVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  long *plVar17;
  int iVar18;
  ulong uVar19;
  seqDef *psVar20;
  uint uVar21;
  ulong uVar22;
  BYTE *pBVar23;
  uint uVar24;
  ulong uVar25;
  long *plVar26;
  int iVar27;
  long *plVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  ulong uVar32;
  U32 UVar33;
  U32 UVar34;
  BYTE *litEnd;
  long *plVar35;
  long *plVar36;
  long *plVar37;
  long *plVar38;
  uint uVar39;
  BYTE *litLimit_w_4;
  int iVar40;
  BYTE *litEnd_3;
  ulong uVar41;
  BYTE *local_e8;
  BYTE *local_e0;
  BYTE *litLimit_w_2;
  uint local_bc;
  long *local_b8;
  uint local_a0;
  BYTE *litLimit_w;
  BYTE *litLimit_w_5;
  BYTE *litLimit_w_1;
  
  if (ms->dictMatchState != (ZSTD_matchState_t *)0x0) {
    __assert_fail("ms->dictMatchState == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x715d,
                  "size_t ZSTD_compressBlock_fast(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t)"
                 );
  }
  uVar31 = (ms->cParams).minMatch;
  uVar16 = (ms->cParams).targetLength;
  pUVar6 = ms->hashTable;
  h = (ms->cParams).hashLog;
  cVar9 = (char)h;
  local_b8 = (long *)src;
  if (uVar16 < 2) {
    pBVar7 = (ms->window).base;
    plVar1 = (long *)((long)src + srcSize);
    iVar40 = (int)pBVar7;
    iVar27 = (int)plVar1 - iVar40;
    uVar30 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
    uVar16 = (ms->window).dictLimit;
    uVar21 = iVar27 - uVar30;
    if (iVar27 - uVar16 <= uVar30) {
      uVar21 = uVar16;
    }
    if (ms->loadedDictEnd != 0) {
      uVar21 = uVar16;
    }
    pBVar2 = pBVar7 + uVar21;
    plVar28 = (long *)((ulong)(pBVar2 == (BYTE *)src) + (long)src);
    iVar27 = (int)plVar28 - iVar40;
    uVar29 = iVar27 - uVar30;
    if (iVar27 - uVar16 <= uVar30) {
      uVar29 = uVar16;
    }
    uVar30 = *rep;
    uVar24 = rep[1];
    if (ms->loadedDictEnd != 0) {
      uVar29 = uVar16;
    }
    uVar29 = iVar27 - uVar29;
    local_a0 = uVar24;
    if (uVar29 < uVar24) {
      local_a0 = 0;
    }
    uVar16 = 0;
    if (uVar30 <= uVar29) {
      uVar16 = uVar30;
    }
    local_e8 = (BYTE *)(ulong)uVar16;
    plVar4 = (long *)((long)src + (srcSize - 8));
    if (uVar31 == 5) {
      bVar13 = 0x40 - cVar9;
      plVar10 = plVar1 + -4;
      while( true ) {
        if (plVar4 <= (long *)((long)plVar28 + 3U)) break;
        if (0x20 < h) goto LAB_001459a3;
        plVar26 = plVar28 + 0x10;
        uVar41 = (ulong)(*plVar28 * -0x30e4432345000000) >> (bVar13 & 0x3f);
        lVar15 = *(long *)((long)plVar28 + 1);
        uVar31 = pUVar6[uVar41];
        lVar14 = -(long)local_e8;
        plVar35 = (long *)((long)plVar28 + 2);
        uVar19 = 2;
        plVar38 = (long *)((long)plVar28 + 3U);
        plVar37 = (long *)((long)plVar28 + 1);
        while( true ) {
          plVar17 = plVar38;
          uVar25 = (ulong)(lVar15 * -0x30e4432345000000) >> (bVar13 & 0x3f);
          uVar16 = (int)plVar28 - iVar40;
          iVar27 = *(int *)((long)plVar35 + lVar14);
          pUVar6[uVar41] = uVar16;
          if (((uint)local_e8 != 0) && ((int)*plVar35 == iVar27)) {
            uVar19 = (ulong)(*(char *)((long)plVar35 - 1) == *(char *)((long)plVar35 + lVar14 + -1))
            ;
            plVar28 = (long *)((long)plVar35 - uVar19);
            pBVar23 = (BYTE *)((long)plVar35 + (lVar14 - uVar19));
            uVar19 = uVar19 | 4;
            pUVar6[uVar25] = (int)plVar37 - iVar40;
            litLimit_w_5 = local_e8;
            UVar33 = 1;
            uVar31 = local_a0;
            goto LAB_001449c1;
          }
          if ((uVar21 <= uVar31) &&
             (uVar32 = (ulong)uVar31, plVar38 = plVar37, (int)*plVar28 == *(int *)(pBVar7 + uVar32))
             ) goto LAB_0014496f;
          uVar31 = pUVar6[uVar25];
          uVar32 = (ulong)uVar31;
          uVar41 = (ulong)(*plVar35 * -0x30e4432345000000) >> (bVar13 & 0x3f);
          uVar16 = (int)plVar37 - iVar40;
          pUVar6[uVar25] = uVar16;
          if ((uVar21 <= uVar31) && ((int)*plVar37 == *(int *)(pBVar7 + uVar32))) break;
          uVar31 = pUVar6[uVar41];
          uVar25 = uVar19;
          if (plVar26 <= (long *)(uVar19 + (long)plVar35)) {
            plVar26 = plVar26 + 0x10;
            uVar25 = uVar19 + 1;
          }
          lVar15 = *plVar17;
          plVar38 = (long *)(uVar19 + (long)plVar17);
          plVar28 = plVar35;
          plVar35 = (long *)(uVar19 + (long)plVar35);
          uVar19 = uVar25;
          plVar37 = plVar17;
          if (plVar4 <= plVar38) goto LAB_001457ef;
        }
        uVar25 = uVar41;
        plVar38 = plVar35;
        plVar28 = plVar37;
        if (uVar19 < 5) {
LAB_0014496f:
          pUVar6[uVar25] = (int)plVar38 - iVar40;
        }
        pBVar23 = pBVar7 + uVar32;
        uVar31 = (int)plVar28 - (int)pBVar23;
        litLimit_w_5 = (BYTE *)(ulong)uVar31;
        if (uVar31 == 0) goto LAB_00145a00;
        UVar33 = uVar31 + 3;
        uVar19 = 4;
        for (; ((uVar31 = (uint)local_e8, pBVar2 < pBVar23 && (local_b8 < plVar28)) &&
               (*(BYTE *)((long)plVar28 + -1) == pBVar23[-1]));
            plVar28 = (long *)((long)plVar28 + -1)) {
          pBVar23 = pBVar23 + -1;
          uVar19 = uVar19 + 1;
        }
LAB_001449c1:
        sVar11 = ZSTD_count((BYTE *)((long)plVar28 + uVar19),pBVar23 + uVar19,(BYTE *)plVar1);
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
        goto LAB_00145908;
        if (0x20000 < seqStore->maxNbLit) goto LAB_00145965;
        uVar41 = (long)plVar28 - (long)local_b8;
        plVar35 = (long *)seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar35 + uVar41))
        goto LAB_00145927;
        if (plVar1 < plVar28) goto LAB_00145946;
        if (plVar10 < plVar28) {
          ZSTD_safecopyLiterals((BYTE *)plVar35,(BYTE *)local_b8,(BYTE *)plVar28,(BYTE *)plVar10);
LAB_00144a50:
          seqStore->lit = seqStore->lit + uVar41;
          if (0xffff < uVar41) {
            if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00145a1f;
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          lVar15 = local_b8[1];
          *plVar35 = *local_b8;
          plVar35[1] = lVar15;
          pBVar23 = seqStore->lit;
          if (0x10 < uVar41) {
            if ((ulong)((long)(pBVar23 + 0x10) + (-0x10 - (long)(local_b8 + 2))) <
                0xffffffffffffffe1) {
              lVar15 = local_b8[3];
              *(long *)(pBVar23 + 0x10) = local_b8[2];
              *(long *)(pBVar23 + 0x18) = lVar15;
              if (0x20 < (long)uVar41) {
                lVar15 = 0;
                do {
                  puVar5 = (undefined8 *)((long)local_b8 + lVar15 + 0x20);
                  uVar8 = puVar5[1];
                  pBVar3 = pBVar23 + lVar15 + 0x20;
                  *(undefined8 *)pBVar3 = *puVar5;
                  *(undefined8 *)(pBVar3 + 8) = uVar8;
                  puVar5 = (undefined8 *)((long)local_b8 + lVar15 + 0x30);
                  uVar8 = puVar5[1];
                  *(undefined8 *)(pBVar3 + 0x10) = *puVar5;
                  *(undefined8 *)(pBVar3 + 0x18) = uVar8;
                  lVar15 = lVar15 + 0x20;
                } while (pBVar3 + 0x20 < pBVar23 + uVar41);
              }
              goto LAB_00144a50;
            }
            goto LAB_00145a3e;
          }
          seqStore->lit = pBVar23 + uVar41;
        }
        uVar19 = sVar11 + uVar19;
        psVar20 = seqStore->sequences;
        psVar20->litLength = (U16)uVar41;
        psVar20->offBase = UVar33;
        if (uVar19 < 3) goto LAB_001458e9;
        if (0xffff < uVar19 - 3) {
          if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00145984;
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar20 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar20->mlBase = (U16)(uVar19 - 3);
        psVar20 = psVar20 + 1;
        seqStore->sequences = psVar20;
        plVar28 = (long *)((long)plVar28 + uVar19);
        local_e8 = litLimit_w_5;
        local_b8 = plVar28;
        local_a0 = uVar31;
        if (plVar28 <= plVar4) {
          if (pBVar7 + (ulong)uVar16 + 2 <= src) goto LAB_001459e1;
          pUVar6[(ulong)(*(long *)(pBVar7 + (ulong)uVar16 + 2) * -0x30e4432345000000) >>
                 (bVar13 & 0x3f)] = uVar16 + 2;
          pUVar6[(ulong)(*(long *)((long)plVar28 + -2) * -0x30e4432345000000) >> (bVar13 & 0x3f)] =
               ((int)plVar28 + -2) - iVar40;
          local_a0 = 0;
          if (uVar31 != 0) {
            for (; (uVar16 = (uint)litLimit_w_5, local_b8 = plVar28, local_e8 = litLimit_w_5,
                   local_a0 = uVar31, plVar28 <= plVar4 &&
                   ((int)*plVar28 == *(int *)((long)plVar28 - (ulong)uVar31)));
                plVar28 = (long *)((long)plVar28 + sVar11 + 4)) {
              sVar11 = ZSTD_count((BYTE *)((long)plVar28 + 4),
                                  (BYTE *)((long)plVar28 + (4 - (ulong)uVar31)),(BYTE *)plVar1);
              pUVar6[(ulong)(*plVar28 * -0x30e4432345000000) >> (bVar13 & 0x3f)] =
                   (int)plVar28 - iVar40;
              if (seqStore->maxNbSeq <= (ulong)((long)psVar20 - (long)seqStore->sequencesStart >> 3)
                 ) goto LAB_00145908;
              if (0x20000 < seqStore->maxNbLit) goto LAB_00145965;
              plVar35 = (long *)seqStore->lit;
              if (seqStore->litStart + seqStore->maxNbLit < plVar35) goto LAB_00145927;
              if (plVar1 < plVar28) goto LAB_00145946;
              if (plVar10 < plVar28) {
                ZSTD_safecopyLiterals
                          ((BYTE *)plVar35,(BYTE *)plVar28,(BYTE *)plVar28,(BYTE *)plVar10);
              }
              else {
                lVar15 = plVar28[1];
                *plVar35 = *plVar28;
                plVar35[1] = lVar15;
              }
              psVar20 = seqStore->sequences;
              psVar20->litLength = 0;
              psVar20->offBase = 1;
              if (sVar11 + 4 < 3) goto LAB_001458e9;
              if (0xffff < sVar11 + 1) {
                if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00145984;
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar20 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar20->mlBase = (U16)(sVar11 + 1);
              psVar20 = psVar20 + 1;
              seqStore->sequences = psVar20;
              litLimit_w_5 = (BYTE *)(ulong)uVar31;
              uVar31 = uVar16;
            }
          }
        }
      }
    }
    else {
      if (uVar31 == 6) {
        plVar10 = plVar1 + -4;
        while( true ) {
          if (plVar4 <= (long *)((long)plVar28 + 3U)) break;
          if (0x20 < h) goto LAB_001459a3;
          litLimit_w_2 = (BYTE *)(plVar28 + 0x10);
          sVar12 = ZSTD_hash6Ptr(plVar28,h);
          sVar11 = ZSTD_hash6Ptr((long *)((long)plVar28 + 1),h);
          UVar33 = pUVar6[sVar12];
          lVar15 = -(long)local_e8;
          plVar35 = (long *)((long)plVar28 + 3U);
          uVar19 = 2;
          plVar38 = (long *)((long)plVar28 + 1);
          plVar37 = (long *)((long)plVar28 + 2);
          while( true ) {
            plVar26 = plVar35;
            UVar34 = (int)plVar28 - iVar40;
            iVar27 = *(int *)((long)plVar37 + lVar15);
            pUVar6[sVar12] = UVar34;
            iVar18 = (int)plVar38;
            if (((uint)local_e8 != 0) && ((int)*plVar37 == iVar27)) {
              uVar19 = (ulong)(*(char *)((long)plVar37 + -1) ==
                              *(char *)((long)plVar37 + lVar15 + -1));
              plVar28 = (long *)((long)plVar37 - uVar19);
              pBVar23 = (BYTE *)((long)plVar37 + (lVar15 - uVar19));
              uVar19 = uVar19 | 4;
              pUVar6[sVar11] = iVar18 - iVar40;
              UVar33 = 1;
              uVar16 = (uint)local_e8;
              uVar31 = local_a0;
              goto LAB_00143ecd;
            }
            if ((uVar21 <= UVar33) &&
               (uVar41 = (ulong)UVar33, (int)*plVar28 == *(int *)(pBVar7 + uVar41)))
            goto LAB_00143e7d;
            uVar31 = pUVar6[sVar11];
            uVar41 = (ulong)uVar31;
            sVar12 = ZSTD_hash6Ptr(plVar37,h);
            UVar34 = iVar18 - iVar40;
            pUVar6[sVar11] = UVar34;
            if ((uVar21 <= uVar31) && ((int)*plVar38 == *(int *)(pBVar7 + uVar41))) break;
            UVar33 = pUVar6[sVar12];
            sVar11 = ZSTD_hash6Ptr(plVar26,h);
            plVar17 = (long *)((long)plVar37 + uVar19);
            uVar41 = uVar19;
            if (litLimit_w_2 <= plVar17) {
              litLimit_w_2 = litLimit_w_2 + 0x80;
              uVar41 = uVar19 + 1;
            }
            plVar35 = (long *)(uVar19 + (long)plVar26);
            plVar28 = plVar37;
            uVar19 = uVar41;
            plVar38 = plVar26;
            plVar37 = plVar17;
            if (plVar4 <= plVar35) goto LAB_00145888;
          }
          iVar18 = (int)plVar37;
          plVar28 = plVar38;
          sVar11 = sVar12;
          if (uVar19 < 5) {
LAB_00143e7d:
            pUVar6[sVar11] = iVar18 - iVar40;
          }
          pBVar23 = pBVar7 + uVar41;
          uVar16 = (int)plVar28 - (int)pBVar23;
          if (uVar16 == 0) goto LAB_00145a00;
          UVar33 = uVar16 + 3;
          uVar19 = 4;
          for (; ((uVar31 = (uint)local_e8, pBVar2 < pBVar23 && (local_b8 < plVar28)) &&
                 (*(BYTE *)((long)plVar28 + -1) == pBVar23[-1]));
              plVar28 = (long *)((long)plVar28 + -1)) {
            pBVar23 = pBVar23 + -1;
            uVar19 = uVar19 + 1;
          }
LAB_00143ecd:
          sVar11 = ZSTD_count((BYTE *)((long)plVar28 + uVar19),pBVar23 + uVar19,(BYTE *)plVar1);
          if (seqStore->maxNbSeq <=
              (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
          goto LAB_00145908;
          if (0x20000 < seqStore->maxNbLit) goto LAB_00145965;
          uVar41 = (long)plVar28 - (long)local_b8;
          plVar35 = (long *)seqStore->lit;
          if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar35 + uVar41))
          goto LAB_00145927;
          if (plVar1 < plVar28) goto LAB_00145946;
          if (plVar10 < plVar28) {
            ZSTD_safecopyLiterals((BYTE *)plVar35,(BYTE *)local_b8,(BYTE *)plVar28,(BYTE *)plVar10);
LAB_00143f58:
            seqStore->lit = seqStore->lit + uVar41;
            if (0xffff < uVar41) {
              if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00145a1f;
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
            }
          }
          else {
            lVar15 = local_b8[1];
            *plVar35 = *local_b8;
            plVar35[1] = lVar15;
            pBVar23 = seqStore->lit;
            if (0x10 < uVar41) {
              if ((ulong)((long)(pBVar23 + 0x10) + (-0x10 - (long)(local_b8 + 2))) <
                  0xffffffffffffffe1) {
                lVar15 = local_b8[3];
                *(long *)(pBVar23 + 0x10) = local_b8[2];
                *(long *)(pBVar23 + 0x18) = lVar15;
                if (0x20 < (long)uVar41) {
                  lVar15 = 0;
                  do {
                    puVar5 = (undefined8 *)((long)local_b8 + lVar15 + 0x20);
                    uVar8 = puVar5[1];
                    pBVar3 = pBVar23 + lVar15 + 0x20;
                    *(undefined8 *)pBVar3 = *puVar5;
                    *(undefined8 *)(pBVar3 + 8) = uVar8;
                    puVar5 = (undefined8 *)((long)local_b8 + lVar15 + 0x30);
                    uVar8 = puVar5[1];
                    *(undefined8 *)(pBVar3 + 0x10) = *puVar5;
                    *(undefined8 *)(pBVar3 + 0x18) = uVar8;
                    lVar15 = lVar15 + 0x20;
                  } while (pBVar3 + 0x20 < pBVar23 + uVar41);
                }
                goto LAB_00143f58;
              }
              goto LAB_00145a3e;
            }
            seqStore->lit = pBVar23 + uVar41;
          }
          uVar19 = sVar11 + uVar19;
          psVar20 = seqStore->sequences;
          psVar20->litLength = (U16)uVar41;
          psVar20->offBase = UVar33;
          if (uVar19 < 3) goto LAB_001458e9;
          if (0xffff < uVar19 - 3) {
            if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00145984;
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar20 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar20->mlBase = (U16)(uVar19 - 3);
          seqStore->sequences = psVar20 + 1;
          plVar28 = (long *)((long)plVar28 + uVar19);
          local_e8 = (BYTE *)(ulong)uVar16;
          local_b8 = plVar28;
          local_a0 = uVar31;
          if (plVar28 <= plVar4) {
            if (pBVar7 + (ulong)UVar34 + 2 <= src) goto LAB_001459e1;
            sVar11 = ZSTD_hash6Ptr(pBVar7 + (ulong)UVar34 + 2,h);
            pUVar6[sVar11] = UVar34 + 2;
            sVar11 = ZSTD_hash6Ptr((void *)((long)plVar28 + -2),h);
            pUVar6[sVar11] = (int)(void *)((long)plVar28 + -2) - iVar40;
            local_a0 = 0;
            local_e8 = (BYTE *)(ulong)uVar16;
            if (uVar31 != 0) {
              for (; (uVar39 = uVar16, local_e8 = (BYTE *)(ulong)uVar39, local_b8 = plVar28,
                     local_a0 = uVar31, plVar28 <= plVar4 &&
                     ((int)*plVar28 == *(int *)((long)plVar28 - (ulong)uVar31)));
                  plVar28 = (long *)((long)plVar28 + sVar11 + 4)) {
                sVar11 = ZSTD_count((BYTE *)((long)plVar28 + 4),
                                    (BYTE *)((long)plVar28 + (4 - (ulong)uVar31)),(BYTE *)plVar1);
                sVar12 = ZSTD_hash6Ptr(plVar28,h);
                pUVar6[sVar12] = (int)plVar28 - iVar40;
                if (seqStore->maxNbSeq <=
                    (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
                goto LAB_00145908;
                if (0x20000 < seqStore->maxNbLit) goto LAB_00145965;
                plVar35 = (long *)seqStore->lit;
                if (seqStore->litStart + seqStore->maxNbLit < plVar35) goto LAB_00145927;
                if (plVar1 < plVar28) goto LAB_00145946;
                if (plVar10 < plVar28) {
                  ZSTD_safecopyLiterals
                            ((BYTE *)plVar35,(BYTE *)plVar28,(BYTE *)plVar28,(BYTE *)plVar10);
                }
                else {
                  lVar15 = plVar28[1];
                  *plVar35 = *plVar28;
                  plVar35[1] = lVar15;
                }
                psVar20 = seqStore->sequences;
                psVar20->litLength = 0;
                psVar20->offBase = 1;
                if (sVar11 + 4 < 3) goto LAB_001458e9;
                if (0xffff < sVar11 + 1) {
                  if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00145984;
                  seqStore->longLengthType = ZSTD_llt_matchLength;
                  seqStore->longLengthPos =
                       (U32)((ulong)((long)psVar20 - (long)seqStore->sequencesStart) >> 3);
                }
                psVar20->mlBase = (U16)(sVar11 + 1);
                seqStore->sequences = psVar20 + 1;
                uVar16 = uVar31;
                uVar31 = uVar39;
              }
            }
          }
        }
LAB_00145888:
        if (uVar24 <= uVar29) {
          uVar24 = 0;
        }
        uVar31 = uVar24;
        if ((uint)local_e8 != 0) {
          uVar31 = uVar30;
        }
        if (uVar30 <= uVar29) {
          uVar31 = uVar24;
          uVar30 = 0;
        }
        if ((uint)local_e8 != 0) {
          uVar30 = (uint)local_e8;
        }
        *rep = uVar30;
        local_bc = local_a0;
        goto LAB_001458c7;
      }
      if (uVar31 == 7) {
        bVar13 = 0x40 - cVar9;
        plVar10 = plVar1 + -4;
        while( true ) {
          if (plVar4 <= (long *)((long)plVar28 + 3U)) break;
          if (0x20 < h) goto LAB_001459a3;
          plVar26 = plVar28 + 0x10;
          uVar41 = (ulong)(*plVar28 * -0x30e44323405a9d00) >> (bVar13 & 0x3f);
          lVar15 = *(long *)((long)plVar28 + 1);
          uVar31 = pUVar6[uVar41];
          lVar14 = -(long)local_e8;
          plVar35 = (long *)((long)plVar28 + 1);
          plVar38 = (long *)((long)plVar28 + 2);
          uVar19 = 2;
          plVar37 = (long *)((long)plVar28 + 3U);
          while( true ) {
            plVar17 = plVar38;
            uVar25 = (ulong)(lVar15 * -0x30e44323405a9d00) >> (bVar13 & 0x3f);
            uVar16 = (int)plVar28 - iVar40;
            iVar27 = *(int *)((long)plVar17 + lVar14);
            pUVar6[uVar41] = uVar16;
            if (((uint)local_e8 != 0) && ((int)*plVar17 == iVar27)) {
              uVar19 = (ulong)(*(char *)((long)plVar17 - 1) ==
                              *(char *)((long)plVar17 + lVar14 + -1));
              plVar28 = (long *)((long)plVar17 - uVar19);
              pBVar23 = (BYTE *)((long)plVar17 + (lVar14 - uVar19));
              uVar19 = uVar19 | 4;
              pUVar6[uVar25] = (int)plVar35 - iVar40;
              litLimit_w_5 = local_e8;
              UVar33 = 1;
              uVar31 = local_a0;
              goto LAB_00143357;
            }
            if ((uVar21 <= uVar31) &&
               (uVar32 = (ulong)uVar31, (int)*plVar28 == *(int *)(pBVar7 + uVar32)))
            goto LAB_00143303;
            uVar31 = pUVar6[uVar25];
            uVar32 = (ulong)uVar31;
            uVar41 = (ulong)(*plVar17 * -0x30e44323405a9d00) >> (bVar13 & 0x3f);
            uVar16 = (int)plVar35 - iVar40;
            pUVar6[uVar25] = uVar16;
            if ((uVar21 <= uVar31) && ((int)*plVar35 == *(int *)(pBVar7 + uVar32))) break;
            uVar31 = pUVar6[uVar41];
            uVar25 = uVar19;
            if (plVar26 <= (long *)((long)plVar17 + uVar19)) {
              plVar26 = plVar26 + 0x10;
              uVar25 = uVar19 + 1;
            }
            lVar15 = *plVar37;
            plVar36 = (long *)(uVar19 + (long)plVar37);
            plVar35 = plVar37;
            plVar38 = (long *)((long)plVar17 + uVar19);
            uVar19 = uVar25;
            plVar37 = plVar36;
            plVar28 = plVar17;
            if (plVar4 <= plVar36) goto LAB_001457ef;
          }
          plVar28 = plVar35;
          plVar35 = plVar17;
          uVar25 = uVar41;
          if (uVar19 < 5) {
LAB_00143303:
            pUVar6[uVar25] = (int)plVar35 - iVar40;
          }
          pBVar23 = pBVar7 + uVar32;
          uVar31 = (int)plVar28 - (int)pBVar23;
          litLimit_w_5 = (BYTE *)(ulong)uVar31;
          if (uVar31 == 0) goto LAB_00145a00;
          UVar33 = uVar31 + 3;
          uVar19 = 4;
          for (; ((uVar31 = (uint)local_e8, pBVar2 < pBVar23 && (local_b8 < plVar28)) &&
                 (*(BYTE *)((long)plVar28 + -1) == pBVar23[-1]));
              plVar28 = (long *)((long)plVar28 + -1)) {
            pBVar23 = pBVar23 + -1;
            uVar19 = uVar19 + 1;
          }
LAB_00143357:
          sVar11 = ZSTD_count((BYTE *)((long)plVar28 + uVar19),pBVar23 + uVar19,(BYTE *)plVar1);
          if (seqStore->maxNbSeq <=
              (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
          goto LAB_00145908;
          if (0x20000 < seqStore->maxNbLit) goto LAB_00145965;
          uVar41 = (long)plVar28 - (long)local_b8;
          plVar35 = (long *)seqStore->lit;
          if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar35 + uVar41))
          goto LAB_00145927;
          if (plVar1 < plVar28) goto LAB_00145946;
          if (plVar10 < plVar28) {
            ZSTD_safecopyLiterals((BYTE *)plVar35,(BYTE *)local_b8,(BYTE *)plVar28,(BYTE *)plVar10);
LAB_001433e6:
            seqStore->lit = seqStore->lit + uVar41;
            if (0xffff < uVar41) {
              if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00145a1f;
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
            }
          }
          else {
            lVar15 = local_b8[1];
            *plVar35 = *local_b8;
            plVar35[1] = lVar15;
            pBVar23 = seqStore->lit;
            if (0x10 < uVar41) {
              if ((ulong)((long)(pBVar23 + 0x10) + (-0x10 - (long)(local_b8 + 2))) <
                  0xffffffffffffffe1) {
                lVar15 = local_b8[3];
                *(long *)(pBVar23 + 0x10) = local_b8[2];
                *(long *)(pBVar23 + 0x18) = lVar15;
                if (0x20 < (long)uVar41) {
                  lVar15 = 0;
                  do {
                    puVar5 = (undefined8 *)((long)local_b8 + lVar15 + 0x20);
                    uVar8 = puVar5[1];
                    pBVar3 = pBVar23 + lVar15 + 0x20;
                    *(undefined8 *)pBVar3 = *puVar5;
                    *(undefined8 *)(pBVar3 + 8) = uVar8;
                    puVar5 = (undefined8 *)((long)local_b8 + lVar15 + 0x30);
                    uVar8 = puVar5[1];
                    *(undefined8 *)(pBVar3 + 0x10) = *puVar5;
                    *(undefined8 *)(pBVar3 + 0x18) = uVar8;
                    lVar15 = lVar15 + 0x20;
                  } while (pBVar3 + 0x20 < pBVar23 + uVar41);
                }
                goto LAB_001433e6;
              }
              goto LAB_00145a3e;
            }
            seqStore->lit = pBVar23 + uVar41;
          }
          uVar19 = sVar11 + uVar19;
          psVar20 = seqStore->sequences;
          psVar20->litLength = (U16)uVar41;
          psVar20->offBase = UVar33;
          if (uVar19 < 3) goto LAB_001458e9;
          if (0xffff < uVar19 - 3) {
            if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00145984;
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar20 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar20->mlBase = (U16)(uVar19 - 3);
          psVar20 = psVar20 + 1;
          seqStore->sequences = psVar20;
          plVar28 = (long *)((long)plVar28 + uVar19);
          local_e8 = litLimit_w_5;
          local_b8 = plVar28;
          local_a0 = uVar31;
          if (plVar28 <= plVar4) {
            if (pBVar7 + (ulong)uVar16 + 2 <= src) goto LAB_001459e1;
            pUVar6[(ulong)(*(long *)(pBVar7 + (ulong)uVar16 + 2) * -0x30e44323405a9d00) >>
                   (bVar13 & 0x3f)] = uVar16 + 2;
            pUVar6[(ulong)(*(long *)((long)plVar28 + -2) * -0x30e44323405a9d00) >> (bVar13 & 0x3f)]
                 = ((int)plVar28 + -2) - iVar40;
            local_a0 = 0;
            if (uVar31 != 0) {
              for (; (uVar16 = (uint)litLimit_w_5, local_b8 = plVar28, local_e8 = litLimit_w_5,
                     local_a0 = uVar31, plVar28 <= plVar4 &&
                     ((int)*plVar28 == *(int *)((long)plVar28 - (ulong)uVar31)));
                  plVar28 = (long *)((long)plVar28 + sVar11 + 4)) {
                sVar11 = ZSTD_count((BYTE *)((long)plVar28 + 4),
                                    (BYTE *)((long)plVar28 + (4 - (ulong)uVar31)),(BYTE *)plVar1);
                pUVar6[(ulong)(*plVar28 * -0x30e44323405a9d00) >> (bVar13 & 0x3f)] =
                     (int)plVar28 - iVar40;
                if (seqStore->maxNbSeq <=
                    (ulong)((long)psVar20 - (long)seqStore->sequencesStart >> 3)) goto LAB_00145908;
                if (0x20000 < seqStore->maxNbLit) goto LAB_00145965;
                plVar35 = (long *)seqStore->lit;
                if (seqStore->litStart + seqStore->maxNbLit < plVar35) goto LAB_00145927;
                if (plVar1 < plVar28) goto LAB_00145946;
                if (plVar10 < plVar28) {
                  ZSTD_safecopyLiterals
                            ((BYTE *)plVar35,(BYTE *)plVar28,(BYTE *)plVar28,(BYTE *)plVar10);
                }
                else {
                  lVar15 = plVar28[1];
                  *plVar35 = *plVar28;
                  plVar35[1] = lVar15;
                }
                psVar20 = seqStore->sequences;
                psVar20->litLength = 0;
                psVar20->offBase = 1;
                if (sVar11 + 4 < 3) goto LAB_001458e9;
                if (0xffff < sVar11 + 1) {
                  if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00145984;
                  seqStore->longLengthType = ZSTD_llt_matchLength;
                  seqStore->longLengthPos =
                       (U32)((ulong)((long)psVar20 - (long)seqStore->sequencesStart) >> 3);
                }
                psVar20->mlBase = (U16)(sVar11 + 1);
                psVar20 = psVar20 + 1;
                seqStore->sequences = psVar20;
                litLimit_w_5 = (BYTE *)(ulong)uVar31;
                uVar31 = uVar16;
              }
            }
          }
        }
      }
      else {
        bVar13 = 0x20 - cVar9;
        plVar10 = plVar1 + -4;
LAB_001452ba:
        if ((long *)((long)plVar28 + 3U) < plVar4) {
          if (0x20 < h) goto LAB_001459a3;
          plVar26 = plVar28 + 0x10;
          uVar41 = (ulong)((uint)((int)*plVar28 * -0x61c8864f) >> (bVar13 & 0x1f));
          iVar27 = *(int *)((long)plVar28 + 1);
          uVar31 = pUVar6[uVar41];
          lVar15 = -(long)local_e8;
          plVar35 = (long *)((long)plVar28 + 1);
          plVar38 = (long *)((long)plVar28 + 2);
          uVar19 = 2;
          plVar37 = (long *)((long)plVar28 + 3U);
          while( true ) {
            plVar17 = plVar38;
            uVar25 = (ulong)((uint)(iVar27 * -0x61c8864f) >> (bVar13 & 0x1f));
            uVar16 = (int)plVar28 - iVar40;
            iVar27 = *(int *)((long)plVar17 + lVar15);
            pUVar6[uVar41] = uVar16;
            if (((uint)local_e8 != 0) && ((int)*plVar17 == iVar27)) {
              uVar19 = (ulong)(*(char *)((long)plVar17 - 1) ==
                              *(char *)((long)plVar17 + lVar15 + -1));
              plVar28 = (long *)((long)plVar17 - uVar19);
              pBVar23 = (BYTE *)((long)plVar17 + (lVar15 - uVar19));
              uVar19 = uVar19 | 4;
              pUVar6[uVar25] = (int)plVar35 - iVar40;
              UVar33 = 1;
              uVar31 = (uint)local_e8;
              uVar39 = local_a0;
              goto LAB_001454a4;
            }
            if ((uVar21 <= uVar31) &&
               (uVar32 = (ulong)uVar31, (int)*plVar28 == *(int *)(pBVar7 + uVar32)))
            goto LAB_0014545c;
            uVar31 = pUVar6[uVar25];
            uVar32 = (ulong)uVar31;
            uVar41 = (ulong)((uint)((int)*plVar17 * -0x61c8864f) >> (bVar13 & 0x1f));
            uVar16 = (int)plVar35 - iVar40;
            pUVar6[uVar25] = uVar16;
            if ((uVar21 <= uVar31) && ((int)*plVar35 == *(int *)(pBVar7 + uVar32))) break;
            uVar31 = pUVar6[uVar41];
            uVar25 = uVar19;
            if (plVar26 <= (long *)((long)plVar17 + uVar19)) {
              plVar26 = plVar26 + 0x10;
              uVar25 = uVar19 + 1;
            }
            iVar27 = (int)*plVar37;
            plVar36 = (long *)(uVar19 + (long)plVar37);
            plVar35 = plVar37;
            plVar38 = (long *)((long)plVar17 + uVar19);
            uVar19 = uVar25;
            plVar28 = plVar17;
            plVar37 = plVar36;
            if (plVar4 <= plVar36) goto LAB_001457ef;
          }
          plVar28 = plVar35;
          plVar35 = plVar17;
          uVar25 = uVar41;
          if (uVar19 < 5) {
LAB_0014545c:
            pUVar6[uVar25] = (int)plVar35 - iVar40;
          }
          pBVar23 = pBVar7 + uVar32;
          uVar31 = (int)plVar28 - (int)pBVar23;
          if (uVar31 == 0) goto LAB_00145a00;
          UVar33 = uVar31 + 3;
          uVar19 = 4;
          for (; ((uVar39 = (uint)local_e8, pBVar2 < pBVar23 && (local_b8 < plVar28)) &&
                 (*(BYTE *)((long)plVar28 + -1) == pBVar23[-1]));
              plVar28 = (long *)((long)plVar28 + -1)) {
            pBVar23 = pBVar23 + -1;
            uVar19 = uVar19 + 1;
          }
LAB_001454a4:
          sVar11 = ZSTD_count((BYTE *)((long)plVar28 + uVar19),pBVar23 + uVar19,(BYTE *)plVar1);
          if (seqStore->maxNbSeq <=
              (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
          goto LAB_00145908;
          if (0x20000 < seqStore->maxNbLit) goto LAB_00145965;
          uVar41 = (long)plVar28 - (long)local_b8;
          plVar35 = (long *)seqStore->lit;
          if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar35 + uVar41))
          goto LAB_00145927;
          if (plVar1 < plVar28) goto LAB_00145946;
          if (plVar10 < plVar28) {
            ZSTD_safecopyLiterals((BYTE *)plVar35,(BYTE *)local_b8,(BYTE *)plVar28,(BYTE *)plVar10);
LAB_00145534:
            seqStore->lit = seqStore->lit + uVar41;
            if (0xffff < uVar41) {
              if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00145a1f;
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
            }
          }
          else {
            lVar15 = local_b8[1];
            *plVar35 = *local_b8;
            plVar35[1] = lVar15;
            pBVar23 = seqStore->lit;
            if (0x10 < uVar41) {
              if ((ulong)((long)(pBVar23 + 0x10) + (-0x10 - (long)(local_b8 + 2))) <
                  0xffffffffffffffe1) {
                lVar15 = local_b8[3];
                *(long *)(pBVar23 + 0x10) = local_b8[2];
                *(long *)(pBVar23 + 0x18) = lVar15;
                if (0x20 < (long)uVar41) {
                  lVar15 = 0;
                  do {
                    puVar5 = (undefined8 *)((long)local_b8 + lVar15 + 0x20);
                    uVar8 = puVar5[1];
                    pBVar3 = pBVar23 + lVar15 + 0x20;
                    *(undefined8 *)pBVar3 = *puVar5;
                    *(undefined8 *)(pBVar3 + 8) = uVar8;
                    puVar5 = (undefined8 *)((long)local_b8 + lVar15 + 0x30);
                    uVar8 = puVar5[1];
                    *(undefined8 *)(pBVar3 + 0x10) = *puVar5;
                    *(undefined8 *)(pBVar3 + 0x18) = uVar8;
                    lVar15 = lVar15 + 0x20;
                  } while (pBVar3 + 0x20 < pBVar23 + uVar41);
                }
                goto LAB_00145534;
              }
              goto LAB_00145a3e;
            }
            seqStore->lit = pBVar23 + uVar41;
          }
          uVar19 = sVar11 + uVar19;
          psVar20 = seqStore->sequences;
          psVar20->litLength = (U16)uVar41;
          psVar20->offBase = UVar33;
          if (uVar19 < 3) goto LAB_001458e9;
          if (0xffff < uVar19 - 3) {
            if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00145984;
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar20 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar20->mlBase = (U16)(uVar19 - 3);
          psVar20 = psVar20 + 1;
          seqStore->sequences = psVar20;
          plVar28 = (long *)((long)plVar28 + uVar19);
          local_e8 = (BYTE *)(ulong)uVar31;
          local_b8 = plVar28;
          local_a0 = uVar39;
          if (plVar28 <= plVar4) {
            if (pBVar7 + (ulong)uVar16 + 2 <= src) goto LAB_001459e1;
            pUVar6[(uint)(*(int *)(pBVar7 + (ulong)uVar16 + 2) * -0x61c8864f) >> (bVar13 & 0x1f)] =
                 uVar16 + 2;
            pUVar6[(uint)(*(int *)((long)plVar28 + -2) * -0x61c8864f) >> (bVar13 & 0x1f)] =
                 ((int)plVar28 + -2) - iVar40;
            local_a0 = 0;
            local_e8 = (BYTE *)(ulong)uVar31;
            if (uVar39 != 0) {
              for (; local_a0 = uVar39, local_e8 = (BYTE *)(ulong)uVar31, local_b8 = plVar28,
                  plVar28 <= plVar4; plVar28 = (long *)((long)plVar28 + sVar11 + 4)) {
                lVar15 = *plVar28;
                if ((int)lVar15 != *(int *)((long)plVar28 - (ulong)local_a0)) break;
                sVar11 = ZSTD_count((BYTE *)((long)plVar28 + 4),
                                    (BYTE *)((long)plVar28 + (4 - (ulong)local_a0)),(BYTE *)plVar1);
                pUVar6[(uint)((int)lVar15 * -0x61c8864f) >> (bVar13 & 0x1f)] = (int)plVar28 - iVar40
                ;
                if (seqStore->maxNbSeq <=
                    (ulong)((long)psVar20 - (long)seqStore->sequencesStart >> 3)) goto LAB_00145908;
                if (0x20000 < seqStore->maxNbLit) goto LAB_00145965;
                plVar35 = (long *)seqStore->lit;
                if (seqStore->litStart + seqStore->maxNbLit < plVar35) goto LAB_00145927;
                if (plVar1 < plVar28) goto LAB_00145946;
                if (plVar10 < plVar28) {
                  ZSTD_safecopyLiterals
                            ((BYTE *)plVar35,(BYTE *)plVar28,(BYTE *)plVar28,(BYTE *)plVar10);
                }
                else {
                  lVar15 = plVar28[1];
                  *plVar35 = *plVar28;
                  plVar35[1] = lVar15;
                }
                psVar20 = seqStore->sequences;
                psVar20->litLength = 0;
                psVar20->offBase = 1;
                if (sVar11 + 4 < 3) goto LAB_001458e9;
                if (0xffff < sVar11 + 1) {
                  if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00145984;
                  seqStore->longLengthType = ZSTD_llt_matchLength;
                  seqStore->longLengthPos =
                       (U32)((ulong)((long)psVar20 - (long)seqStore->sequencesStart) >> 3);
                }
                psVar20->mlBase = (U16)(sVar11 + 1);
                psVar20 = psVar20 + 1;
                seqStore->sequences = psVar20;
                uVar39 = uVar31;
                uVar31 = local_a0;
              }
            }
          }
          goto LAB_001452ba;
        }
      }
    }
LAB_001457ef:
    if (uVar24 <= uVar29) {
      uVar24 = 0;
    }
    uVar31 = uVar24;
    if ((uint)local_e8 != 0) {
      uVar31 = uVar30;
    }
    if (uVar30 <= uVar29) {
      uVar31 = uVar24;
      uVar30 = 0;
    }
    if ((uint)local_e8 != 0) {
      uVar30 = (uint)local_e8;
    }
    *rep = uVar30;
    local_bc = local_a0;
  }
  else {
    pBVar7 = (ms->window).base;
    plVar1 = (long *)((long)src + srcSize);
    iVar40 = (int)pBVar7;
    iVar27 = (int)plVar1 - iVar40;
    uVar29 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
    uVar21 = (ms->window).dictLimit;
    uVar30 = iVar27 - uVar29;
    if (iVar27 - uVar21 <= uVar29) {
      uVar30 = uVar21;
    }
    if (ms->loadedDictEnd != 0) {
      uVar30 = uVar21;
    }
    pBVar2 = pBVar7 + uVar30;
    plVar28 = (long *)((ulong)(pBVar2 == (BYTE *)src) + (long)src);
    iVar27 = (int)plVar28 - iVar40;
    uVar24 = iVar27 - uVar29;
    if (iVar27 - uVar21 <= uVar29) {
      uVar24 = uVar21;
    }
    if (ms->loadedDictEnd != 0) {
      uVar24 = uVar21;
    }
    uVar19 = (ulong)(uVar16 + 1);
    uVar16 = *rep;
    uVar21 = rep[1];
    uVar24 = iVar27 - uVar24;
    local_bc = uVar21;
    if (uVar24 < uVar21) {
      local_bc = 0;
    }
    uVar29 = 0;
    if (uVar16 <= uVar24) {
      uVar29 = uVar16;
    }
    local_e0 = (BYTE *)(ulong)uVar29;
    plVar4 = (long *)((long)src + (srcSize - 8));
    if (uVar31 == 5) {
      bVar13 = 0x40 - cVar9;
      plVar10 = plVar1 + -4;
      while( true ) {
        plVar35 = (long *)((long)plVar28 + uVar19 + 1);
        if (plVar4 <= plVar35) break;
        if (0x20 < h) goto LAB_001459a3;
        plVar26 = plVar28 + 0x10;
        uVar25 = (ulong)(*plVar28 * -0x30e4432345000000) >> (bVar13 & 0x3f);
        lVar15 = *(long *)((long)plVar28 + 1);
        uVar31 = pUVar6[uVar25];
        lVar14 = -(long)local_e0;
        plVar38 = (long *)((long)plVar28 + uVar19);
        uVar41 = uVar19;
        plVar37 = (long *)((long)plVar28 + 1);
        while( true ) {
          plVar17 = plVar35;
          uVar32 = (ulong)(lVar15 * -0x30e4432345000000) >> (bVar13 & 0x3f);
          uVar29 = (int)plVar28 - iVar40;
          iVar27 = *(int *)((long)plVar38 + lVar14);
          pUVar6[uVar25] = uVar29;
          if (((uint)local_e0 != 0) && ((int)*plVar38 == iVar27)) {
            uVar41 = (ulong)(*(char *)((long)plVar38 - 1) == *(char *)((long)plVar38 + lVar14 + -1))
            ;
            plVar28 = (long *)((long)plVar38 - uVar41);
            pBVar23 = (BYTE *)((long)plVar38 + (lVar14 - uVar41));
            uVar41 = uVar41 | 4;
            pUVar6[uVar32] = (int)plVar37 - iVar40;
            litLimit_w = local_e0;
            UVar33 = 1;
            local_e0._0_4_ = local_bc;
            goto LAB_001443dc;
          }
          if ((uVar30 <= uVar31) &&
             (uVar22 = (ulong)uVar31, plVar35 = plVar37, (int)*plVar28 == *(int *)(pBVar7 + uVar22))
             ) goto LAB_0014476e;
          uVar31 = pUVar6[uVar32];
          uVar22 = (ulong)uVar31;
          uVar25 = (ulong)(*plVar38 * -0x30e4432345000000) >> (bVar13 & 0x3f);
          uVar29 = (int)plVar37 - iVar40;
          pUVar6[uVar32] = uVar29;
          if ((uVar30 <= uVar31) && ((int)*plVar37 == *(int *)(pBVar7 + uVar22))) break;
          uVar31 = pUVar6[uVar25];
          uVar32 = uVar41;
          if (plVar26 <= (long *)(uVar41 + (long)plVar38)) {
            plVar26 = plVar26 + 0x10;
            uVar32 = uVar41 + 1;
          }
          lVar15 = *plVar17;
          plVar35 = (long *)(uVar41 + (long)plVar17);
          plVar28 = plVar38;
          plVar38 = (long *)(uVar41 + (long)plVar38);
          uVar41 = uVar32;
          plVar37 = plVar17;
          if (plVar4 <= plVar35) goto LAB_00145258;
        }
        uVar32 = uVar25;
        plVar35 = plVar38;
        plVar28 = plVar37;
        if (uVar41 < 5) {
LAB_0014476e:
          pUVar6[uVar32] = (int)plVar35 - iVar40;
        }
        pBVar23 = pBVar7 + uVar22;
        uVar31 = (int)plVar28 - (int)pBVar23;
        litLimit_w = (BYTE *)(ulong)uVar31;
        if (uVar31 == 0) goto LAB_00145a00;
        UVar33 = uVar31 + 3;
        uVar41 = 4;
        for (; ((pBVar2 < pBVar23 && (local_b8 < plVar28)) &&
               (*(BYTE *)((long)plVar28 + -1) == pBVar23[-1]));
            plVar28 = (long *)((long)plVar28 + -1)) {
          pBVar23 = pBVar23 + -1;
          uVar41 = uVar41 + 1;
        }
LAB_001443dc:
        uVar31 = (uint)local_e0;
        sVar11 = ZSTD_count((BYTE *)((long)plVar28 + uVar41),pBVar23 + uVar41,(BYTE *)plVar1);
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
        goto LAB_00145908;
        if (0x20000 < seqStore->maxNbLit) goto LAB_00145965;
        uVar25 = (long)plVar28 - (long)local_b8;
        plVar35 = (long *)seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar35 + uVar25))
        goto LAB_00145927;
        if (plVar1 < plVar28) goto LAB_00145946;
        if (plVar10 < plVar28) {
          ZSTD_safecopyLiterals((BYTE *)plVar35,(BYTE *)local_b8,(BYTE *)plVar28,(BYTE *)plVar10);
LAB_0014446d:
          seqStore->lit = seqStore->lit + uVar25;
          if (0xffff < uVar25) {
            if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00145a1f;
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          lVar15 = local_b8[1];
          *plVar35 = *local_b8;
          plVar35[1] = lVar15;
          pBVar23 = seqStore->lit;
          if (0x10 < uVar25) {
            if ((ulong)((long)(pBVar23 + 0x10) + (-0x10 - (long)(local_b8 + 2))) <
                0xffffffffffffffe1) {
              lVar15 = local_b8[3];
              *(long *)(pBVar23 + 0x10) = local_b8[2];
              *(long *)(pBVar23 + 0x18) = lVar15;
              if (0x20 < (long)uVar25) {
                lVar15 = 0;
                do {
                  puVar5 = (undefined8 *)((long)local_b8 + lVar15 + 0x20);
                  uVar8 = puVar5[1];
                  pBVar3 = pBVar23 + lVar15 + 0x20;
                  *(undefined8 *)pBVar3 = *puVar5;
                  *(undefined8 *)(pBVar3 + 8) = uVar8;
                  puVar5 = (undefined8 *)((long)local_b8 + lVar15 + 0x30);
                  uVar8 = puVar5[1];
                  *(undefined8 *)(pBVar3 + 0x10) = *puVar5;
                  *(undefined8 *)(pBVar3 + 0x18) = uVar8;
                  lVar15 = lVar15 + 0x20;
                } while (pBVar3 + 0x20 < pBVar23 + uVar25);
              }
              goto LAB_0014446d;
            }
            goto LAB_00145a3e;
          }
          seqStore->lit = pBVar23 + uVar25;
        }
        uVar41 = sVar11 + uVar41;
        psVar20 = seqStore->sequences;
        psVar20->litLength = (U16)uVar25;
        psVar20->offBase = UVar33;
        if (uVar41 < 3) goto LAB_001458e9;
        if (0xffff < uVar41 - 3) {
          if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00145984;
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar20 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar20->mlBase = (U16)(uVar41 - 3);
        psVar20 = psVar20 + 1;
        seqStore->sequences = psVar20;
        plVar28 = (long *)((long)plVar28 + uVar41);
        local_e0 = litLimit_w;
        local_b8 = plVar28;
        local_bc = uVar31;
        if (plVar28 <= plVar4) {
          if (pBVar7 + (ulong)uVar29 + 2 <= src) goto LAB_001459e1;
          pUVar6[(ulong)(*(long *)(pBVar7 + (ulong)uVar29 + 2) * -0x30e4432345000000) >>
                 (bVar13 & 0x3f)] = uVar29 + 2;
          pUVar6[(ulong)(*(long *)((long)plVar28 + -2) * -0x30e4432345000000) >> (bVar13 & 0x3f)] =
               ((int)plVar28 + -2) - iVar40;
          local_bc = 0;
          if (uVar31 != 0) {
            for (; (uVar29 = (uint)litLimit_w, local_b8 = plVar28, local_e0 = litLimit_w,
                   local_bc = uVar31, plVar28 <= plVar4 &&
                   ((int)*plVar28 == *(int *)((long)plVar28 - (ulong)uVar31)));
                plVar28 = (long *)((long)plVar28 + sVar11 + 4)) {
              sVar11 = ZSTD_count((BYTE *)((long)plVar28 + 4),
                                  (BYTE *)((long)plVar28 + (4 - (ulong)uVar31)),(BYTE *)plVar1);
              pUVar6[(ulong)(*plVar28 * -0x30e4432345000000) >> (bVar13 & 0x3f)] =
                   (int)plVar28 - iVar40;
              if (seqStore->maxNbSeq <= (ulong)((long)psVar20 - (long)seqStore->sequencesStart >> 3)
                 ) goto LAB_00145908;
              if (0x20000 < seqStore->maxNbLit) goto LAB_00145965;
              plVar35 = (long *)seqStore->lit;
              if (seqStore->litStart + seqStore->maxNbLit < plVar35) goto LAB_00145927;
              if (plVar1 < plVar28) goto LAB_00145946;
              if (plVar10 < plVar28) {
                ZSTD_safecopyLiterals
                          ((BYTE *)plVar35,(BYTE *)plVar28,(BYTE *)plVar28,(BYTE *)plVar10);
              }
              else {
                lVar15 = plVar28[1];
                *plVar35 = *plVar28;
                plVar35[1] = lVar15;
              }
              psVar20 = seqStore->sequences;
              psVar20->litLength = 0;
              psVar20->offBase = 1;
              if (sVar11 + 4 < 3) goto LAB_001458e9;
              if (0xffff < sVar11 + 1) {
                if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00145984;
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar20 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar20->mlBase = (U16)(sVar11 + 1);
              psVar20 = psVar20 + 1;
              seqStore->sequences = psVar20;
              litLimit_w = (BYTE *)(ulong)uVar31;
              uVar31 = uVar29;
            }
          }
        }
      }
    }
    else {
      if (uVar31 == 6) {
        plVar10 = plVar1 + -4;
        while( true ) {
          plVar35 = (long *)((long)plVar28 + uVar19 + 1);
          if (plVar4 <= plVar35) break;
          if (0x20 < h) goto LAB_001459a3;
          litLimit_w = (BYTE *)(plVar28 + 0x10);
          sVar12 = ZSTD_hash6Ptr(plVar28,h);
          sVar11 = ZSTD_hash6Ptr((long *)((long)plVar28 + 1),h);
          UVar33 = pUVar6[sVar12];
          lVar15 = -(long)local_e0;
          plVar38 = (long *)((long)plVar28 + 1);
          plVar37 = (long *)((long)plVar28 + uVar19);
          uVar41 = uVar19;
          while( true ) {
            plVar26 = plVar35;
            uVar31 = (int)plVar28 - iVar40;
            iVar27 = *(int *)((long)plVar37 + lVar15);
            pUVar6[sVar12] = uVar31;
            iVar18 = (int)plVar38;
            if (((uint)local_e0 != 0) && ((int)*plVar37 == iVar27)) {
              uVar41 = (ulong)(*(char *)((long)plVar37 + -1) ==
                              *(char *)((long)plVar37 + lVar15 + -1));
              plVar28 = (long *)((long)plVar37 - uVar41);
              pBVar23 = (BYTE *)((long)plVar37 + (lVar15 - uVar41));
              uVar41 = uVar41 | 4;
              pUVar6[sVar11] = iVar18 - iVar40;
              UVar33 = 1;
              uVar39 = (uint)local_e0;
              uVar29 = local_bc;
              goto LAB_00143915;
            }
            if ((uVar30 <= UVar33) &&
               (uVar25 = (ulong)UVar33, (int)*plVar28 == *(int *)(pBVar7 + uVar25)))
            goto LAB_001438c4;
            uVar29 = pUVar6[sVar11];
            uVar25 = (ulong)uVar29;
            sVar12 = ZSTD_hash6Ptr(plVar37,h);
            uVar31 = iVar18 - iVar40;
            pUVar6[sVar11] = uVar31;
            if ((uVar30 <= uVar29) && ((int)*plVar38 == *(int *)(pBVar7 + uVar25))) break;
            UVar33 = pUVar6[sVar12];
            sVar11 = ZSTD_hash6Ptr(plVar26,h);
            uVar25 = uVar41;
            if (litLimit_w <= (long *)((long)plVar37 + uVar41)) {
              litLimit_w = litLimit_w + 0x80;
              uVar25 = uVar41 + 1;
            }
            plVar35 = (long *)(uVar41 + (long)plVar26);
            plVar28 = plVar37;
            plVar38 = plVar26;
            plVar37 = (long *)((long)plVar37 + uVar41);
            uVar41 = uVar25;
            if (plVar4 <= plVar35) goto LAB_00145840;
          }
          iVar18 = (int)plVar37;
          plVar28 = plVar38;
          sVar11 = sVar12;
          if (uVar41 < 5) {
LAB_001438c4:
            pUVar6[sVar11] = iVar18 - iVar40;
          }
          pBVar23 = pBVar7 + uVar25;
          uVar39 = (int)plVar28 - (int)pBVar23;
          if (uVar39 == 0) goto LAB_00145a00;
          UVar33 = uVar39 + 3;
          uVar41 = 4;
          for (; ((uVar29 = (uint)local_e0, pBVar2 < pBVar23 && (local_b8 < plVar28)) &&
                 (*(BYTE *)((long)plVar28 + -1) == pBVar23[-1]));
              plVar28 = (long *)((long)plVar28 + -1)) {
            pBVar23 = pBVar23 + -1;
            uVar41 = uVar41 + 1;
          }
LAB_00143915:
          sVar11 = ZSTD_count((BYTE *)((long)plVar28 + uVar41),pBVar23 + uVar41,(BYTE *)plVar1);
          if (seqStore->maxNbSeq <=
              (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
          goto LAB_00145908;
          if (0x20000 < seqStore->maxNbLit) goto LAB_00145965;
          uVar25 = (long)plVar28 - (long)local_b8;
          plVar35 = (long *)seqStore->lit;
          if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar35 + uVar25))
          goto LAB_00145927;
          if (plVar1 < plVar28) goto LAB_00145946;
          if (plVar10 < plVar28) {
            ZSTD_safecopyLiterals((BYTE *)plVar35,(BYTE *)local_b8,(BYTE *)plVar28,(BYTE *)plVar10);
LAB_001439a6:
            seqStore->lit = seqStore->lit + uVar25;
            if (0xffff < uVar25) {
              if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00145a1f;
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
            }
          }
          else {
            lVar15 = local_b8[1];
            *plVar35 = *local_b8;
            plVar35[1] = lVar15;
            pBVar23 = seqStore->lit;
            if (0x10 < uVar25) {
              if ((ulong)((long)(pBVar23 + 0x10) + (-0x10 - (long)(local_b8 + 2))) <
                  0xffffffffffffffe1) {
                lVar15 = local_b8[3];
                *(long *)(pBVar23 + 0x10) = local_b8[2];
                *(long *)(pBVar23 + 0x18) = lVar15;
                if (0x20 < (long)uVar25) {
                  lVar15 = 0;
                  do {
                    puVar5 = (undefined8 *)((long)local_b8 + lVar15 + 0x20);
                    uVar8 = puVar5[1];
                    pBVar3 = pBVar23 + lVar15 + 0x20;
                    *(undefined8 *)pBVar3 = *puVar5;
                    *(undefined8 *)(pBVar3 + 8) = uVar8;
                    puVar5 = (undefined8 *)((long)local_b8 + lVar15 + 0x30);
                    uVar8 = puVar5[1];
                    *(undefined8 *)(pBVar3 + 0x10) = *puVar5;
                    *(undefined8 *)(pBVar3 + 0x18) = uVar8;
                    lVar15 = lVar15 + 0x20;
                  } while (pBVar3 + 0x20 < pBVar23 + uVar25);
                }
                goto LAB_001439a6;
              }
              goto LAB_00145a3e;
            }
            seqStore->lit = pBVar23 + uVar25;
          }
          uVar41 = sVar11 + uVar41;
          psVar20 = seqStore->sequences;
          psVar20->litLength = (U16)uVar25;
          psVar20->offBase = UVar33;
          if (uVar41 < 3) goto LAB_001458e9;
          if (0xffff < uVar41 - 3) {
            if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00145984;
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar20 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar20->mlBase = (U16)(uVar41 - 3);
          seqStore->sequences = psVar20 + 1;
          plVar28 = (long *)((long)plVar28 + uVar41);
          local_e0 = (BYTE *)(ulong)uVar39;
          local_b8 = plVar28;
          local_bc = uVar29;
          if (plVar28 <= plVar4) {
            if (pBVar7 + (ulong)uVar31 + 2 <= src) goto LAB_001459e1;
            sVar11 = ZSTD_hash6Ptr(pBVar7 + (ulong)uVar31 + 2,h);
            pUVar6[sVar11] = uVar31 + 2;
            sVar11 = ZSTD_hash6Ptr((void *)((long)plVar28 + -2),h);
            pUVar6[sVar11] = (int)(void *)((long)plVar28 + -2) - iVar40;
            local_bc = 0;
            local_e0 = (BYTE *)(ulong)uVar39;
            if (uVar29 != 0) {
              for (; (uVar31 = uVar39, local_e0 = (BYTE *)(ulong)uVar31, local_b8 = plVar28,
                     local_bc = uVar29, plVar28 <= plVar4 &&
                     ((int)*plVar28 == *(int *)((long)plVar28 - (ulong)uVar29)));
                  plVar28 = (long *)((long)plVar28 + sVar11 + 4)) {
                sVar11 = ZSTD_count((BYTE *)((long)plVar28 + 4),
                                    (BYTE *)((long)plVar28 + (4 - (ulong)uVar29)),(BYTE *)plVar1);
                sVar12 = ZSTD_hash6Ptr(plVar28,h);
                pUVar6[sVar12] = (int)plVar28 - iVar40;
                if (seqStore->maxNbSeq <=
                    (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
                goto LAB_00145908;
                if (0x20000 < seqStore->maxNbLit) goto LAB_00145965;
                plVar35 = (long *)seqStore->lit;
                if (seqStore->litStart + seqStore->maxNbLit < plVar35) goto LAB_00145927;
                if (plVar1 < plVar28) goto LAB_00145946;
                if (plVar10 < plVar28) {
                  ZSTD_safecopyLiterals
                            ((BYTE *)plVar35,(BYTE *)plVar28,(BYTE *)plVar28,(BYTE *)plVar10);
                }
                else {
                  lVar15 = plVar28[1];
                  *plVar35 = *plVar28;
                  plVar35[1] = lVar15;
                }
                psVar20 = seqStore->sequences;
                psVar20->litLength = 0;
                psVar20->offBase = 1;
                if (sVar11 + 4 < 3) goto LAB_001458e9;
                if (0xffff < sVar11 + 1) {
                  if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00145984;
                  seqStore->longLengthType = ZSTD_llt_matchLength;
                  seqStore->longLengthPos =
                       (U32)((ulong)((long)psVar20 - (long)seqStore->sequencesStart) >> 3);
                }
                psVar20->mlBase = (U16)(sVar11 + 1);
                seqStore->sequences = psVar20 + 1;
                uVar39 = uVar29;
                uVar29 = uVar31;
              }
            }
          }
        }
LAB_00145840:
        if (uVar21 <= uVar24) {
          uVar21 = 0;
        }
        uVar31 = uVar21;
        if ((uint)local_e0 != 0) {
          uVar31 = uVar16;
        }
        if (uVar16 <= uVar24) {
          uVar31 = uVar21;
          uVar16 = 0;
        }
        if ((uint)local_e0 != 0) {
          uVar16 = (uint)local_e0;
        }
        *rep = uVar16;
LAB_001458c7:
        if (local_bc != 0) {
          uVar31 = local_bc;
        }
        rep[1] = uVar31;
        goto LAB_001458cf;
      }
      if (uVar31 == 7) {
        bVar13 = 0x40 - cVar9;
        plVar10 = plVar1 + -4;
        while( true ) {
          plVar35 = (long *)((long)plVar28 + uVar19 + 1);
          if (plVar4 <= plVar35) break;
          if (0x20 < h) {
LAB_001459a3:
            __assert_fail("hBits <= 32",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x4730,"size_t ZSTD_hashPtr(const void *, U32, U32)");
          }
          plVar26 = plVar28 + 0x10;
          uVar25 = (ulong)(*plVar28 * -0x30e44323405a9d00) >> (bVar13 & 0x3f);
          lVar15 = *(long *)((long)plVar28 + 1);
          uVar31 = pUVar6[uVar25];
          lVar14 = -(long)local_e0;
          plVar38 = (long *)((long)plVar28 + 1);
          plVar37 = (long *)((long)plVar28 + uVar19);
          uVar41 = uVar19;
          while( true ) {
            plVar17 = plVar37;
            uVar32 = (ulong)(lVar15 * -0x30e44323405a9d00) >> (bVar13 & 0x3f);
            uVar29 = (int)plVar28 - iVar40;
            iVar27 = *(int *)((long)plVar17 + lVar14);
            pUVar6[uVar25] = uVar29;
            if (((uint)local_e0 != 0) && ((int)*plVar17 == iVar27)) {
              uVar41 = (ulong)(*(char *)((long)plVar17 - 1) ==
                              *(char *)((long)plVar17 + lVar14 + -1));
              plVar28 = (long *)((long)plVar17 - uVar41);
              pBVar23 = (BYTE *)((long)plVar17 + (lVar14 - uVar41));
              uVar41 = uVar41 | 4;
              pUVar6[uVar32] = (int)plVar38 - iVar40;
              litLimit_w_2 = local_e0;
              UVar33 = 1;
              local_e0._0_4_ = local_bc;
              goto LAB_00142d27;
            }
            if ((uVar30 <= uVar31) &&
               (uVar22 = (ulong)uVar31, (int)*plVar28 == *(int *)(pBVar7 + uVar22)))
            goto LAB_00142ce1;
            uVar31 = pUVar6[uVar32];
            uVar22 = (ulong)uVar31;
            uVar25 = (ulong)(*plVar17 * -0x30e44323405a9d00) >> (bVar13 & 0x3f);
            uVar29 = (int)plVar38 - iVar40;
            pUVar6[uVar32] = uVar29;
            if ((uVar30 <= uVar31) && ((int)*plVar38 == *(int *)(pBVar7 + uVar22))) break;
            uVar31 = pUVar6[uVar25];
            uVar32 = uVar41;
            if (plVar26 <= (long *)((long)plVar17 + uVar41)) {
              plVar26 = plVar26 + 0x10;
              uVar32 = uVar41 + 1;
            }
            lVar15 = *plVar35;
            plVar36 = (long *)(uVar41 + (long)plVar35);
            plVar38 = plVar35;
            plVar37 = (long *)((long)plVar17 + uVar41);
            uVar41 = uVar32;
            plVar35 = plVar36;
            plVar28 = plVar17;
            if (plVar4 <= plVar36) goto LAB_00145258;
          }
          plVar28 = plVar38;
          plVar38 = plVar17;
          uVar32 = uVar25;
          if (uVar41 < 5) {
LAB_00142ce1:
            pUVar6[uVar32] = (int)plVar38 - iVar40;
          }
          pBVar23 = pBVar7 + uVar22;
          uVar31 = (int)plVar28 - (int)pBVar23;
          litLimit_w_2 = (BYTE *)(ulong)uVar31;
          if (uVar31 == 0) {
LAB_00145a00:
            __assert_fail("(rep_offset1)>0",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x711c,
                          "size_t ZSTD_compressBlock_fast_noDict_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
                         );
          }
          UVar33 = uVar31 + 3;
          uVar41 = 4;
          for (; ((pBVar2 < pBVar23 && (local_b8 < plVar28)) &&
                 (*(BYTE *)((long)plVar28 + -1) == pBVar23[-1]));
              plVar28 = (long *)((long)plVar28 + -1)) {
            pBVar23 = pBVar23 + -1;
            uVar41 = uVar41 + 1;
          }
LAB_00142d27:
          uVar31 = (uint)local_e0;
          sVar11 = ZSTD_count((BYTE *)((long)plVar28 + uVar41),pBVar23 + uVar41,(BYTE *)plVar1);
          if (seqStore->maxNbSeq <=
              (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
LAB_00145908:
            __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x468b,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (0x20000 < seqStore->maxNbLit) {
LAB_00145965:
            __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x468d,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          uVar25 = (long)plVar28 - (long)local_b8;
          plVar35 = (long *)seqStore->lit;
          if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar35 + uVar25)) {
LAB_00145927:
            __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x468e,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (plVar1 < plVar28) {
LAB_00145946:
            __assert_fail("literals + litLength <= litLimit",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x468f,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (plVar10 < plVar28) {
            ZSTD_safecopyLiterals((BYTE *)plVar35,(BYTE *)local_b8,(BYTE *)plVar28,(BYTE *)plVar10);
LAB_00142db5:
            seqStore->lit = seqStore->lit + uVar25;
            if (0xffff < uVar25) {
              if (seqStore->longLengthType != ZSTD_llt_none) {
LAB_00145a1f:
                __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x46a0,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
            }
          }
          else {
            lVar15 = local_b8[1];
            *plVar35 = *local_b8;
            plVar35[1] = lVar15;
            pBVar23 = seqStore->lit;
            if (0x10 < uVar25) {
              if (0xffffffffffffffe0 <
                  (ulong)((long)(pBVar23 + 0x10) + (-0x10 - (long)(local_b8 + 2)))) {
LAB_00145a3e:
                __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x36a6,
                              "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                             );
              }
              lVar15 = local_b8[3];
              *(long *)(pBVar23 + 0x10) = local_b8[2];
              *(long *)(pBVar23 + 0x18) = lVar15;
              if (0x20 < (long)uVar25) {
                lVar15 = 0;
                do {
                  puVar5 = (undefined8 *)((long)local_b8 + lVar15 + 0x20);
                  uVar8 = puVar5[1];
                  pBVar3 = pBVar23 + lVar15 + 0x20;
                  *(undefined8 *)pBVar3 = *puVar5;
                  *(undefined8 *)(pBVar3 + 8) = uVar8;
                  puVar5 = (undefined8 *)((long)local_b8 + lVar15 + 0x30);
                  uVar8 = puVar5[1];
                  *(undefined8 *)(pBVar3 + 0x10) = *puVar5;
                  *(undefined8 *)(pBVar3 + 0x18) = uVar8;
                  lVar15 = lVar15 + 0x20;
                } while (pBVar3 + 0x20 < pBVar23 + uVar25);
              }
              goto LAB_00142db5;
            }
            seqStore->lit = pBVar23 + uVar25;
          }
          uVar41 = sVar11 + uVar41;
          psVar20 = seqStore->sequences;
          psVar20->litLength = (U16)uVar25;
          psVar20->offBase = UVar33;
          if (uVar41 < 3) {
LAB_001458e9:
            __assert_fail("matchLength >= MINMATCH",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x46aa,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (0xffff < uVar41 - 3) {
            if (seqStore->longLengthType != ZSTD_llt_none) {
LAB_00145984:
              __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x46ad,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar20 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar20->mlBase = (U16)(uVar41 - 3);
          psVar20 = psVar20 + 1;
          seqStore->sequences = psVar20;
          plVar28 = (long *)((long)plVar28 + uVar41);
          local_e0 = litLimit_w_2;
          local_b8 = plVar28;
          local_bc = uVar31;
          if (plVar28 <= plVar4) {
            if (pBVar7 + (ulong)uVar29 + 2 <= src) {
LAB_001459e1:
              __assert_fail("base+current0+2 > istart",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x7133,
                            "size_t ZSTD_compressBlock_fast_noDict_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
                           );
            }
            pUVar6[(ulong)(*(long *)(pBVar7 + (ulong)uVar29 + 2) * -0x30e44323405a9d00) >>
                   (bVar13 & 0x3f)] = uVar29 + 2;
            pUVar6[(ulong)(*(long *)((long)plVar28 + -2) * -0x30e44323405a9d00) >> (bVar13 & 0x3f)]
                 = ((int)plVar28 + -2) - iVar40;
            local_bc = 0;
            if (uVar31 != 0) {
              for (; (uVar29 = (uint)litLimit_w_2, local_b8 = plVar28, local_e0 = litLimit_w_2,
                     local_bc = uVar31, plVar28 <= plVar4 &&
                     ((int)*plVar28 == *(int *)((long)plVar28 - (ulong)uVar31)));
                  plVar28 = (long *)((long)plVar28 + sVar11 + 4)) {
                sVar11 = ZSTD_count((BYTE *)((long)plVar28 + 4),
                                    (BYTE *)((long)plVar28 + (4 - (ulong)uVar31)),(BYTE *)plVar1);
                pUVar6[(ulong)(*plVar28 * -0x30e44323405a9d00) >> (bVar13 & 0x3f)] =
                     (int)plVar28 - iVar40;
                if (seqStore->maxNbSeq <=
                    (ulong)((long)psVar20 - (long)seqStore->sequencesStart >> 3)) goto LAB_00145908;
                if (0x20000 < seqStore->maxNbLit) goto LAB_00145965;
                plVar35 = (long *)seqStore->lit;
                if (seqStore->litStart + seqStore->maxNbLit < plVar35) goto LAB_00145927;
                if (plVar1 < plVar28) goto LAB_00145946;
                if (plVar10 < plVar28) {
                  ZSTD_safecopyLiterals
                            ((BYTE *)plVar35,(BYTE *)plVar28,(BYTE *)plVar28,(BYTE *)plVar10);
                }
                else {
                  lVar15 = plVar28[1];
                  *plVar35 = *plVar28;
                  plVar35[1] = lVar15;
                }
                psVar20 = seqStore->sequences;
                psVar20->litLength = 0;
                psVar20->offBase = 1;
                if (sVar11 + 4 < 3) goto LAB_001458e9;
                if (0xffff < sVar11 + 1) {
                  if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00145984;
                  seqStore->longLengthType = ZSTD_llt_matchLength;
                  seqStore->longLengthPos =
                       (U32)((ulong)((long)psVar20 - (long)seqStore->sequencesStart) >> 3);
                }
                psVar20->mlBase = (U16)(sVar11 + 1);
                psVar20 = psVar20 + 1;
                seqStore->sequences = psVar20;
                litLimit_w_2 = (BYTE *)(ulong)uVar31;
                uVar31 = uVar29;
              }
            }
          }
        }
      }
      else {
        bVar13 = 0x20 - cVar9;
        plVar10 = plVar1 + -4;
LAB_00144d41:
        plVar35 = (long *)((long)plVar28 + uVar19 + 1);
        if (plVar35 < plVar4) {
          if (0x20 < h) goto LAB_001459a3;
          plVar26 = plVar28 + 0x10;
          uVar25 = (ulong)((uint)((int)*plVar28 * -0x61c8864f) >> (bVar13 & 0x1f));
          iVar27 = *(int *)((long)plVar28 + 1);
          uVar31 = pUVar6[uVar25];
          lVar15 = -(long)local_e0;
          plVar38 = (long *)((long)plVar28 + 1);
          plVar37 = (long *)((long)plVar28 + uVar19);
          uVar41 = uVar19;
          while( true ) {
            plVar17 = plVar37;
            uVar32 = (ulong)((uint)(iVar27 * -0x61c8864f) >> (bVar13 & 0x1f));
            uVar29 = (int)plVar28 - iVar40;
            iVar27 = *(int *)((long)plVar17 + lVar15);
            pUVar6[uVar25] = uVar29;
            if (((uint)local_e0 != 0) && ((int)*plVar17 == iVar27)) {
              uVar41 = (ulong)(*(char *)((long)plVar17 - 1) ==
                              *(char *)((long)plVar17 + lVar15 + -1));
              plVar28 = (long *)((long)plVar17 - uVar41);
              pBVar23 = (BYTE *)((long)plVar17 + (lVar15 - uVar41));
              uVar41 = uVar41 | 4;
              pUVar6[uVar32] = (int)plVar38 - iVar40;
              UVar33 = 1;
              uVar31 = (uint)local_e0;
              uVar39 = local_bc;
              goto LAB_00144f14;
            }
            if ((uVar30 <= uVar31) &&
               (uVar22 = (ulong)uVar31, (int)*plVar28 == *(int *)(pBVar7 + uVar22)))
            goto LAB_00144ec4;
            uVar31 = pUVar6[uVar32];
            uVar22 = (ulong)uVar31;
            uVar25 = (ulong)((uint)((int)*plVar17 * -0x61c8864f) >> (bVar13 & 0x1f));
            uVar29 = (int)plVar38 - iVar40;
            pUVar6[uVar32] = uVar29;
            if ((uVar30 <= uVar31) && ((int)*plVar38 == *(int *)(pBVar7 + uVar22))) break;
            uVar31 = pUVar6[uVar25];
            uVar32 = uVar41;
            if (plVar26 <= (long *)((long)plVar17 + uVar41)) {
              plVar26 = plVar26 + 0x10;
              uVar32 = uVar41 + 1;
            }
            iVar27 = (int)*plVar35;
            plVar36 = (long *)(uVar41 + (long)plVar35);
            plVar38 = plVar35;
            plVar37 = (long *)((long)plVar17 + uVar41);
            uVar41 = uVar32;
            plVar28 = plVar17;
            plVar35 = plVar36;
            if (plVar4 <= plVar36) goto LAB_00145258;
          }
          plVar28 = plVar38;
          plVar38 = plVar17;
          uVar32 = uVar25;
          if (uVar41 < 5) {
LAB_00144ec4:
            pUVar6[uVar32] = (int)plVar38 - iVar40;
          }
          pBVar23 = pBVar7 + uVar22;
          uVar31 = (int)plVar28 - (int)pBVar23;
          if (uVar31 == 0) goto LAB_00145a00;
          UVar33 = uVar31 + 3;
          uVar41 = 4;
          for (; ((uVar39 = (uint)local_e0, pBVar2 < pBVar23 && (local_b8 < plVar28)) &&
                 (*(BYTE *)((long)plVar28 + -1) == pBVar23[-1]));
              plVar28 = (long *)((long)plVar28 + -1)) {
            pBVar23 = pBVar23 + -1;
            uVar41 = uVar41 + 1;
          }
LAB_00144f14:
          sVar11 = ZSTD_count((BYTE *)((long)plVar28 + uVar41),pBVar23 + uVar41,(BYTE *)plVar1);
          if (seqStore->maxNbSeq <=
              (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
          goto LAB_00145908;
          if (0x20000 < seqStore->maxNbLit) goto LAB_00145965;
          uVar25 = (long)plVar28 - (long)local_b8;
          plVar35 = (long *)seqStore->lit;
          if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar35 + uVar25))
          goto LAB_00145927;
          if (plVar1 < plVar28) goto LAB_00145946;
          if (plVar10 < plVar28) {
            ZSTD_safecopyLiterals((BYTE *)plVar35,(BYTE *)local_b8,(BYTE *)plVar28,(BYTE *)plVar10);
LAB_00144fa5:
            seqStore->lit = seqStore->lit + uVar25;
            if (0xffff < uVar25) {
              if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00145a1f;
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
            }
          }
          else {
            lVar15 = local_b8[1];
            *plVar35 = *local_b8;
            plVar35[1] = lVar15;
            pBVar23 = seqStore->lit;
            if (0x10 < uVar25) {
              if ((ulong)((long)(pBVar23 + 0x10) + (-0x10 - (long)(local_b8 + 2))) <
                  0xffffffffffffffe1) {
                lVar15 = local_b8[3];
                *(long *)(pBVar23 + 0x10) = local_b8[2];
                *(long *)(pBVar23 + 0x18) = lVar15;
                if (0x20 < (long)uVar25) {
                  lVar15 = 0;
                  do {
                    puVar5 = (undefined8 *)((long)local_b8 + lVar15 + 0x20);
                    uVar8 = puVar5[1];
                    pBVar3 = pBVar23 + lVar15 + 0x20;
                    *(undefined8 *)pBVar3 = *puVar5;
                    *(undefined8 *)(pBVar3 + 8) = uVar8;
                    puVar5 = (undefined8 *)((long)local_b8 + lVar15 + 0x30);
                    uVar8 = puVar5[1];
                    *(undefined8 *)(pBVar3 + 0x10) = *puVar5;
                    *(undefined8 *)(pBVar3 + 0x18) = uVar8;
                    lVar15 = lVar15 + 0x20;
                  } while (pBVar3 + 0x20 < pBVar23 + uVar25);
                }
                goto LAB_00144fa5;
              }
              goto LAB_00145a3e;
            }
            seqStore->lit = pBVar23 + uVar25;
          }
          uVar41 = sVar11 + uVar41;
          psVar20 = seqStore->sequences;
          psVar20->litLength = (U16)uVar25;
          psVar20->offBase = UVar33;
          if (uVar41 < 3) goto LAB_001458e9;
          if (0xffff < uVar41 - 3) {
            if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00145984;
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar20 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar20->mlBase = (U16)(uVar41 - 3);
          psVar20 = psVar20 + 1;
          seqStore->sequences = psVar20;
          plVar28 = (long *)((long)plVar28 + uVar41);
          local_e0 = (BYTE *)(ulong)uVar31;
          local_b8 = plVar28;
          local_bc = uVar39;
          if (plVar28 <= plVar4) {
            if (pBVar7 + (ulong)uVar29 + 2 <= src) goto LAB_001459e1;
            pUVar6[(uint)(*(int *)(pBVar7 + (ulong)uVar29 + 2) * -0x61c8864f) >> (bVar13 & 0x1f)] =
                 uVar29 + 2;
            pUVar6[(uint)(*(int *)((long)plVar28 + -2) * -0x61c8864f) >> (bVar13 & 0x1f)] =
                 ((int)plVar28 + -2) - iVar40;
            local_bc = 0;
            local_e0 = (BYTE *)(ulong)uVar31;
            if (uVar39 != 0) {
              for (; local_bc = uVar39, local_e0 = (BYTE *)(ulong)uVar31, local_b8 = plVar28,
                  plVar28 <= plVar4; plVar28 = (long *)((long)plVar28 + sVar11 + 4)) {
                lVar15 = *plVar28;
                if ((int)lVar15 != *(int *)((long)plVar28 - (ulong)local_bc)) break;
                sVar11 = ZSTD_count((BYTE *)((long)plVar28 + 4),
                                    (BYTE *)((long)plVar28 + (4 - (ulong)local_bc)),(BYTE *)plVar1);
                pUVar6[(uint)((int)lVar15 * -0x61c8864f) >> (bVar13 & 0x1f)] = (int)plVar28 - iVar40
                ;
                if (seqStore->maxNbSeq <=
                    (ulong)((long)psVar20 - (long)seqStore->sequencesStart >> 3)) goto LAB_00145908;
                if (0x20000 < seqStore->maxNbLit) goto LAB_00145965;
                plVar35 = (long *)seqStore->lit;
                if (seqStore->litStart + seqStore->maxNbLit < plVar35) goto LAB_00145927;
                if (plVar1 < plVar28) goto LAB_00145946;
                if (plVar10 < plVar28) {
                  ZSTD_safecopyLiterals
                            ((BYTE *)plVar35,(BYTE *)plVar28,(BYTE *)plVar28,(BYTE *)plVar10);
                }
                else {
                  lVar15 = plVar28[1];
                  *plVar35 = *plVar28;
                  plVar35[1] = lVar15;
                }
                psVar20 = seqStore->sequences;
                psVar20->litLength = 0;
                psVar20->offBase = 1;
                if (sVar11 + 4 < 3) goto LAB_001458e9;
                if (0xffff < sVar11 + 1) {
                  if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00145984;
                  seqStore->longLengthType = ZSTD_llt_matchLength;
                  seqStore->longLengthPos =
                       (U32)((ulong)((long)psVar20 - (long)seqStore->sequencesStart) >> 3);
                }
                psVar20->mlBase = (U16)(sVar11 + 1);
                psVar20 = psVar20 + 1;
                seqStore->sequences = psVar20;
                uVar39 = uVar31;
                uVar31 = local_bc;
              }
            }
          }
          goto LAB_00144d41;
        }
      }
    }
LAB_00145258:
    if (uVar21 <= uVar24) {
      uVar21 = 0;
    }
    uVar31 = uVar21;
    if ((uint)local_e0 != 0) {
      uVar31 = uVar16;
    }
    if (uVar16 <= uVar24) {
      uVar31 = uVar21;
      uVar16 = 0;
    }
    if ((uint)local_e0 != 0) {
      uVar16 = (uint)local_e0;
    }
    *rep = uVar16;
  }
  if (local_bc != 0) {
    uVar31 = local_bc;
  }
  rep[1] = uVar31;
LAB_001458cf:
  return (long)src + (srcSize - (long)local_b8);
}

Assistant:

size_t ZSTD_compressBlock_fast(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    U32 const mls = ms->cParams.minMatch;
    assert(ms->dictMatchState == NULL);
    if (ms->cParams.targetLength > 1) {
        switch(mls)
        {
        default: /* includes case 3 */
        case 4 :
            return ZSTD_compressBlock_fast_noDict_4_1(ms, seqStore, rep, src, srcSize);
        case 5 :
            return ZSTD_compressBlock_fast_noDict_5_1(ms, seqStore, rep, src, srcSize);
        case 6 :
            return ZSTD_compressBlock_fast_noDict_6_1(ms, seqStore, rep, src, srcSize);
        case 7 :
            return ZSTD_compressBlock_fast_noDict_7_1(ms, seqStore, rep, src, srcSize);
        }
    } else {
        switch(mls)
        {
        default: /* includes case 3 */
        case 4 :
            return ZSTD_compressBlock_fast_noDict_4_0(ms, seqStore, rep, src, srcSize);
        case 5 :
            return ZSTD_compressBlock_fast_noDict_5_0(ms, seqStore, rep, src, srcSize);
        case 6 :
            return ZSTD_compressBlock_fast_noDict_6_0(ms, seqStore, rep, src, srcSize);
        case 7 :
            return ZSTD_compressBlock_fast_noDict_7_0(ms, seqStore, rep, src, srcSize);
        }

    }
}